

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydbalance.cpp
# Opt level: O0

double __thiscall
HydBalance::findHeadErrorNorm
          (HydBalance *this,double lamda,double *dH,double *dQ,double *xQ,Network *nw)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *__to;
  int __x;
  Network *pNVar5;
  double dVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double h2;
  double h1;
  double err;
  double flow;
  double flowChange;
  int n2;
  int n1;
  Link *link;
  int i;
  int linkCount;
  double count;
  double norm;
  Network *nw_local;
  double *xQ_local;
  double *dQ_local;
  double *dH_local;
  double lamda_local;
  HydBalance *this_local;
  long *plVar4;
  long *plVar6;
  
  count = 0.0;
  _i = 0.0;
  this->maxHeadErr = 0.0;
  this->maxFlowChange = 0.0;
  this->maxFlowChangeLink = 0;
  iVar2 = Network::count(nw,LINK);
  __to = extraout_RDX;
  for (link._0_4_ = 0; (int)(uint)link < iVar2; link._0_4_ = (uint)link + 1) {
    pNVar5 = nw;
    iVar3 = Network::link(nw,(char *)(ulong)(uint)link,__to);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    iVar3 = *(int *)(plVar4[6] + 0x28);
    iVar1 = *(int *)(plVar4[7] + 0x28);
    dVar7 = (double)plVar4[0xd] + lamda * dQ[(int)(uint)link];
    xQ[iVar3] = xQ[iVar3] - dVar7;
    xQ[iVar1] = dVar7 + xQ[iVar1];
    std::abs((int)pNVar5);
    if (this->maxFlowChange <= extraout_XMM0_Qa && extraout_XMM0_Qa != this->maxFlowChange) {
      this->maxFlowChange = extraout_XMM0_Qa;
      this->maxFlowChangeLink = (uint)link;
    }
    plVar6 = plVar4;
    (**(code **)(*plVar4 + 0x90))(dVar7,plVar4,nw);
    __x = (int)plVar6;
    dVar7 = lamda * dH[iVar3] + *(double *)(plVar4[6] + 0x60);
    dVar8 = lamda * dH[iVar1] + *(double *)(plVar4[7] + 0x60);
    if (((double)plVar4[0x10] == 0.0) && (!NAN((double)plVar4[0x10]))) {
      plVar4[0xf] = (long)(dVar7 - dVar8);
    }
    dVar7 = (dVar7 - dVar8) - (double)plVar4[0xf];
    std::abs(__x);
    __to = extraout_RDX_00;
    if (this->maxHeadErr <= extraout_XMM0_Qa_00 && extraout_XMM0_Qa_00 != this->maxHeadErr) {
      std::abs(__x);
      this->maxHeadErr = extraout_XMM0_Qa_01;
      this->maxHeadErrLink = (uint)link;
      __to = extraout_RDX_01;
    }
    count = dVar7 * dVar7 + count;
    _i = _i + 1.0;
  }
  if ((_i != 0.0) || (NAN(_i))) {
    this_local = (HydBalance *)(count / _i);
  }
  else {
    this_local = (HydBalance *)0x0;
  }
  return (double)this_local;
}

Assistant:

double HydBalance::findHeadErrorNorm(
        double lamda, double dH[], double dQ[], double xQ[], Network* nw)
{
    double norm = 0.0;
    double count = 0.0;
    maxHeadErr = 0.0;
    maxFlowChange = 0.0;
    maxFlowChangeLink = 0;

    int linkCount = nw->count(Element::LINK);
    for (int i = 0; i < linkCount; i++)
    {
        // ... identify link's end nodes

        Link* link = nw->link(i);
        int n1 = link->fromNode->index;
        int n2 = link->toNode->index;

        // ... apply updated flow to end node flow balances

        double flowChange = lamda * dQ[i];
        double flow = link->flow + flowChange;
        xQ[n1] -= flow;
        xQ[n2] += flow;

        // ... update network's max. flow change

        double err = abs(flowChange);
        if ( err > maxFlowChange )
        {
            maxFlowChange = err;
            maxFlowChangeLink = i;
        }

        // ... compute head loss and its gradient (head loss is saved
        // ... to link->hLoss and its gradient to link->hGrad)
//*******************************************************************
        link->findHeadLoss(nw, flow);
//*******************************************************************

        // ... evaluate head loss error

        double h1 = link->fromNode->head + lamda * dH[n1];
        double h2 = link->toNode->head + lamda * dH[n2];
        if ( link->hGrad == 0.0 ) link->hLoss = h1 - h2;
        err = h1 - h2 - link->hLoss;
        if ( abs(err) > maxHeadErr )
        {
            maxHeadErr = abs(err);
            maxHeadErrLink = i;
        }

        // ... update sum of squared errors

        norm += err * err;
        count += 1.0;
    }

    // ... return sum of squared errors normalized by link count

    if ( count == 0.0 ) return 0;
    else return norm / count;

}